

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

xmlXPathObjectPtr xmlXPathCacheWrapNodeSet(xmlXPathParserContextPtr pctxt,xmlNodeSetPtr val)

{
  void *pvVar1;
  xmlXPathObjectPtr pxVar2;
  xmlXPathContextCachePtr cache;
  
  if (((pctxt->context == (xmlXPathContextPtr)0x0) ||
      (pvVar1 = pctxt->context->cache, pvVar1 == (void *)0x0)) ||
     (pxVar2 = *(xmlXPathObjectPtr *)((long)pvVar1 + 8), pxVar2 == (xmlXPathObjectPtr)0x0)) {
    pxVar2 = xmlXPathWrapNodeSet(val);
    if (pxVar2 == (xmlXPathObjectPtr)0x0) {
      xmlXPathPErrMemory(pctxt);
      pxVar2 = (xmlXPathObjectPtr)0x0;
    }
  }
  else {
    *(xmlChar **)((long)pvVar1 + 8) = pxVar2->stringval;
    *(int *)((long)pvVar1 + 0x18) = *(int *)((long)pvVar1 + 0x18) + -1;
    pxVar2->stringval = (xmlChar *)0x0;
    pxVar2->type = XPATH_NODESET;
    pxVar2->nodesetval = val;
  }
  return pxVar2;
}

Assistant:

static xmlXPathObjectPtr
xmlXPathCacheWrapNodeSet(xmlXPathParserContextPtr pctxt, xmlNodeSetPtr val)
{
    xmlXPathObjectPtr ret;
    xmlXPathContextPtr ctxt = pctxt->context;

    if ((ctxt != NULL) && (ctxt->cache != NULL)) {
	xmlXPathContextCachePtr cache =
	    (xmlXPathContextCachePtr) ctxt->cache;

	if (cache->miscObjs != NULL) {
	    ret = cache->miscObjs;
            cache->miscObjs = (void *) ret->stringval;
            cache->numMisc -= 1;
            ret->stringval = NULL;
	    ret->type = XPATH_NODESET;
	    ret->nodesetval = val;
	    return(ret);
	}
    }

    ret = xmlXPathWrapNodeSet(val);
    if (ret == NULL)
        xmlXPathPErrMemory(pctxt);
    return(ret);
}